

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandQuaReach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nIters;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nIters = 0x100;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Ivh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else {
        iVar2 = Abc_NtkGetChoiceNum(pAVar3);
        if (iVar2 == 0) {
          if (pAVar3->nObjCounts[8] == 0) {
            if (pAVar3->ntkType == ABC_NTK_STRASH) {
              if (pAVar3->vPos->nSize < 2) {
                if ((pAVar3->vPis->nSize & 1) == 0) {
                  pAVar3 = Abc_NtkReachability(pAVar3,nIters,fVerbose);
                  if (pAVar3 != (Abc_Ntk_t *)0x0) {
                    Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                    return 0;
                  }
                  Abc_Print(-1,"Command has failed.\n");
                  return 0;
                }
                pcVar4 = "The transition relation should have an even number of inputs.\n";
              }
              else {
                pcVar4 = "The transition relation should have one output.\n";
              }
            }
            else {
              pcVar4 = "This command works only for strashed networks.\n";
            }
          }
          else {
            pcVar4 = "This command works only for combinational transition relations.\n";
          }
        }
        else {
          pcVar4 = "This command cannot be applied to an AIG with choice nodes.\n";
        }
      }
      iVar2 = -1;
      goto LAB_0022f239;
    }
    if (iVar1 != 0x49) goto LAB_0022f1af;
    if (argc <= globalUtilOptind) break;
    nIters = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nIters < 0) {
LAB_0022f1af:
      iVar2 = -2;
      Abc_Print(-2,"usage: qreach [-I num] [-vh]\n");
      Abc_Print(-2,"\t         computes unreachable states using AIG-based quantification\n");
      Abc_Print(-2,"\t         assumes that the current network is a transition relation\n");
      Abc_Print(-2,"\t         assumes that the initial state is composed of all zeros\n");
      Abc_Print(-2,"\t-I num : the number of image computations to perform [default = %d]\n",
                (ulong)nIters);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0022f239:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_0022f1af;
}

Assistant:

int Abc_CommandQuaReach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nIters, fVerbose;
    extern Abc_Ntk_t * Abc_NtkReachability( Abc_Ntk_t * pNtk, int nIters, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nIters   = 256;
    fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }
    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational transition relations.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    if ( Abc_NtkPoNum(pNtk) > 1 )
    {
        Abc_Print( -1, "The transition relation should have one output.\n" );
        return 1;
    }
    if ( Abc_NtkPiNum(pNtk) % 2 != 0 )
    {
        Abc_Print( -1, "The transition relation should have an even number of inputs.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkReachability( pNtk, nIters, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: qreach [-I num] [-vh]\n" );
    Abc_Print( -2, "\t         computes unreachable states using AIG-based quantification\n" );
    Abc_Print( -2, "\t         assumes that the current network is a transition relation\n" );
    Abc_Print( -2, "\t         assumes that the initial state is composed of all zeros\n" );
    Abc_Print( -2, "\t-I num : the number of image computations to perform [default = %d]\n", nIters );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}